

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O1

int lyv_data_content(lyd_node *node,int options,unres_data *unres)

{
  undefined2 uVar1;
  lys_node *node_00;
  ly_ctx *ctx;
  int iVar2;
  uint uVar3;
  lys_node *plVar4;
  lyd_node *plVar5;
  lys_ext_instance **pplVar6;
  byte bVar7;
  LYS_NODE LVar8;
  LY_VLOG_ELEM elem_type;
  LY_DATA_TYPE base_type;
  LY_ECODE ecode;
  lys_node *plVar9;
  char **ppcVar10;
  unres_data *puVar11;
  lys_module *mod1;
  char *pcVar12;
  lyd_node **pplVar13;
  ulong uVar14;
  long lVar15;
  lys_ext_instance *local_40;
  lys_type *local_38;
  
  if (node == (lyd_node *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/validation.c"
                  ,0x2ad,"int lyv_data_content(struct lyd_node *, int, struct unres_data *)");
  }
  node_00 = node->schema;
  if (node_00 == (lys_node *)0x0) {
    __assert_fail("node->schema",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/validation.c"
                  ,0x2ae,"int lyv_data_content(struct lyd_node *, int, struct unres_data *)");
  }
  if (unres == (unres_data *)0x0) {
    __assert_fail("unres",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/validation.c"
                  ,0x2af,"int lyv_data_content(struct lyd_node *, int, struct unres_data *)");
  }
  plVar5 = node;
  base_type = options;
  if ((node_00->nodetype & (LYS_ACTION|LYS_RPC|LYS_NOTIF)) == LYS_UNKNOWN) {
    do {
      plVar5 = plVar5->parent;
      if (plVar5 == (lyd_node *)0x0) {
        if ((options & 0x50U) != 0) {
          options = options | 0x2000;
        }
        break;
      }
      uVar1 = (undefined2)plVar5->schema->nodetype;
      base_type = (LY_DATA_TYPE)(ushort)uVar1;
    } while ((uVar1 & (LYS_ACTION|LYS_RPC|LYS_NOTIF)) == LYS_UNKNOWN);
  }
  ctx = node_00->module->ctx;
  if ((node->validity & 4) == 0) {
    local_38 = (lys_type *)0x0;
    goto LAB_0012050d;
  }
  if ((options & 0x2080U) == 0) {
    if (((node_00->nodetype == LYS_LIST) && ((options & 6U) == 0)) &&
       ((ulong)node_00->padding[2] != 0)) {
      pplVar13 = &node->child;
      uVar14 = 0;
      do {
        plVar5 = *pplVar13;
        if ((plVar5 == (lyd_node *)0x0) ||
           (plVar5->schema != *(lys_node **)(*(long *)&node_00[1].flags + uVar14 * 8))) {
          ly_vlog(ctx,LYE_MISSELEM,LY_VLOG_LYD,node,
                  **(undefined8 **)(*(long *)&node_00[1].flags + uVar14 * 8),node_00->name);
          if (plVar5 == (lyd_node *)0x0) {
            return 1;
          }
          do {
            if (plVar5->schema == *(lys_node **)(*(long *)&node_00[1].flags + uVar14 * 8)) {
              ly_vlog(node_00->module->ctx,LYE_SPEC,LY_VLOG_LYD,plVar5,
                      "Invalid position of the key element.");
              return 1;
            }
            plVar5 = plVar5->next;
          } while (plVar5 != (lyd_node *)0x0);
          return 1;
        }
        uVar14 = uVar14 + 1;
        pplVar13 = &plVar5->next;
      } while (node_00->padding[2] != uVar14);
    }
    puVar11 = unres;
    if ((node_00->nodetype & (LYS_ANYDATA|LYS_LEAF|LYS_CONTAINER)) != LYS_UNKNOWN) {
      for (plVar5 = lyd_first_sibling(node); plVar5 != (lyd_node *)0x0; plVar5 = plVar5->next) {
        if ((plVar5 != node) && (plVar5->schema == node_00)) {
          plVar4 = lys_parent(node_00);
          pcVar12 = node_00->name;
          if (plVar4 == (lys_node *)0x0) {
            local_40 = (lys_ext_instance *)0x1a4e4a;
          }
          else {
            local_40 = *(lys_ext_instance **)
                        (plVar4->padding + (ulong)(plVar4->nodetype == LYS_EXT) * 0x10 + -0x1c);
          }
          ecode = LYE_TOOMANY;
          goto LAB_001208d0;
        }
      }
    }
    base_type = (LY_DATA_TYPE)puVar11;
    if (((uint)options >> 0xb & 1) != 0) {
      plVar4 = node->schema;
      do {
        if ((plVar4->flags & 0x38) == 0x20) {
          ly_vlog(ctx,LYE_OBSDATA,LY_VLOG_LYD,node,node_00->name);
          return 1;
        }
        plVar4 = lys_parent(plVar4);
        base_type = (LY_DATA_TYPE)puVar11;
      } while ((plVar4 != (lys_node *)0x0) &&
              ((plVar4->nodetype & (LYS_ANYDATA|LYS_LIST|LYS_LEAFLIST|LYS_LEAF|LYS_CONTAINER)) ==
               LYS_UNKNOWN));
      if ((node_00->nodetype & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) {
        for (pplVar6 = node->schema[1].ext; pplVar6 != (lys_ext_instance **)0x0;
            pplVar6 = (lys_ext_instance **)pplVar6[9]) {
          if ((*(ushort *)(pplVar6 + 3) & 0x38) == 0x20) {
            pcVar12 = node_00->name;
            local_40 = *pplVar6;
            ecode = LYE_OBSTYPE;
LAB_001208d0:
            elem_type = LY_VLOG_LYD;
LAB_00120937:
            ly_vlog(ctx,ecode,elem_type,node,pcVar12,local_40);
            return 1;
          }
        }
        if (*(int *)&node[1].schema == 7) {
          plVar5 = node->child;
          mod1 = node_00->module;
          iVar2 = lyp_check_status(node_00->flags,mod1,node_00->name,*(uint16_t *)&plVar5->next,
                                   *(lys_module **)&plVar5->hash,(char *)plVar5->schema,
                                   (lys_node *)0x0);
          base_type = (LY_DATA_TYPE)mod1;
          if (iVar2 != 0) {
            ly_vlog(ctx,LYE_PATH,LY_VLOG_LYD,node);
            return 1;
          }
        }
      }
    }
  }
  if ((node_00->flags & 0x2000) == 0) {
LAB_00120501:
    local_38 = (lys_type *)0x0;
  }
  else {
    base_type = (LY_DATA_TYPE)node_00->ext_size;
    iVar2 = lyv_extension(node_00->ext,node_00->ext_size,node);
    if (iVar2 != 0) {
      return 1;
    }
    if ((node_00->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) goto LAB_00120501;
    local_38 = (lys_type *)&node_00[1].ref;
    ppcVar10 = (char **)local_38;
    iVar2 = lyv_type_extension((lyd_node_leaf_list *)node,local_38,1);
    base_type = (LY_DATA_TYPE)ppcVar10;
    if (iVar2 != 0) {
      return 1;
    }
  }
  node->validity = node->validity & 0xfb;
LAB_0012050d:
  if ((node_00->nodetype & (LYS_ACTION|LYS_RPC|LYS_NOTIF|LYS_LIST|LYS_CONTAINER)) != LYS_UNKNOWN) {
    plVar9 = node_00;
    plVar4 = lys_getnext((lys_node *)0x0,node_00,(lys_module *)0x0,0);
    base_type = (LY_DATA_TYPE)plVar9;
    while (plVar4 != (lys_node *)0x0) {
      if ((plVar4->nodetype & (LYS_LIST|LYS_LEAFLIST)) != LYS_UNKNOWN) {
        for (plVar5 = node->child; plVar5 != (lyd_node *)0x0; plVar5 = plVar5->next) {
          if ((plVar5->schema == plVar4) && ((plVar5->validity & 1) != 0)) {
            if ((options & 0x2006U) == 0) {
              iVar2 = lyv_data_dup(plVar5,node->child);
              if (iVar2 != 0) {
                return 1;
              }
            }
            else {
              plVar5->validity = plVar5->validity & 0xfe;
            }
            break;
          }
        }
      }
      plVar9 = node_00;
      plVar4 = lys_getnext(plVar4,node_00,(lys_module *)0x0,0);
      base_type = (LY_DATA_TYPE)plVar9;
    }
  }
  if ((node->validity & 2) != 0) {
    if (((uint)options >> 0xd & 1) == 0) {
      plVar5 = node;
      iVar2 = unres_data_add(unres,node,UNRES_UNIQ_LEAVES);
      base_type = (LY_DATA_TYPE)plVar5;
      if (iVar2 != 0) {
        return 1;
      }
    }
    else {
      node->validity = node->validity & 0xfd;
    }
  }
  if ((node_00->nodetype & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) {
    iVar2 = *(int *)&node[1].schema;
    if (iVar2 == 7) {
      plVar4 = (lys_node *)node->child;
      local_40 = (lys_ext_instance *)0x1a524f;
    }
    else {
      if (iVar2 != 6) {
        plVar5 = (lyd_node *)unres;
        if (iVar2 != 2) {
          LVar8 = LYS_UNKNOWN;
          bVar7 = 0;
          goto LAB_00120976;
        }
        local_38 = find_orig_type((lys_type *)&node->schema[1].ref,base_type);
        local_40 = (lys_ext_instance *)0x1a5246;
        LVar8 = LYS_UNKNOWN;
        goto LAB_00120949;
      }
      plVar4 = (lys_node *)node->child;
      local_40 = (lys_ext_instance *)0x1a524a;
    }
    LVar8 = LYS_UNKNOWN;
LAB_00120964:
    bVar7 = plVar4->iffeature_size;
    plVar5 = (lyd_node *)plVar4->iffeature;
LAB_00120976:
    while (bVar7 != 0) {
      lVar15 = 0;
      do {
        iVar2 = resolve_iffeature((lys_iffeature *)((long)&plVar5->schema + lVar15));
        if (iVar2 == 0) {
          ly_vlog(ctx,LYE_INVAL,LY_VLOG_LYD,node,node->ht,node_00->name);
          pcVar12 = "%s \"%s\" is disabled by its if-feature condition.";
          ecode = LYE_SPEC;
          elem_type = LY_VLOG_PREV;
          node = (lyd_node *)0x0;
          goto LAB_00120937;
        }
        lVar15 = lVar15 + 0x20;
      } while ((ulong)bVar7 << 5 != lVar15);
      if (*(int *)&node[1].schema != 2) break;
      while( true ) {
        LVar8 = LVar8 + LYS_CONTAINER;
LAB_00120949:
        if ((local_38->info).bits.count <= LVar8) break;
        plVar4 = (&node->child->schema)[LVar8];
        if (plVar4 != (lys_node *)0x0) goto LAB_00120964;
      }
      bVar7 = 0;
    }
  }
  if ((options & 0x208eU) == 0) {
    uVar3 = resolve_applies_must(node);
    if (((uVar3 & 1) != 0) && (iVar2 = unres_data_add(unres,node,UNRES_MUST), iVar2 != 0)) {
      return 1;
    }
    if (((uVar3 & 2) != 0) && (iVar2 = unres_data_add(unres,node,UNRES_MUST_INOUT), iVar2 != 0)) {
      return 1;
    }
  }
  return 0;
}

Assistant:

int
lyv_data_content(struct lyd_node *node, int options, struct unres_data *unres)
{
    const struct lys_node *schema, *siter, *parent;
    struct lyd_node *diter, *start = NULL;
    struct lys_ident *ident;
    struct lys_tpdf *tpdf;
    struct lys_type *type = NULL;
    struct lyd_node_leaf_list *leaf;
    unsigned int i, j = 0;
    uint8_t iff_size;
    struct lys_iffeature *iff;
    const char *id, *idname;
    struct ly_ctx *ctx;

    assert(node);
    assert(node->schema);
    assert(unres);

    schema = node->schema; /* shortcut */
    ctx = schema->module->ctx;

    if (!(node->schema->nodetype & (LYS_NOTIF | LYS_RPC | LYS_ACTION))) {
        for (diter = node->parent; diter; diter = diter->parent) {
            if (diter->schema->nodetype & (LYS_NOTIF | LYS_RPC | LYS_ACTION)) {
                break;
            }
        }
        if (!diter && (options & (LYD_OPT_NOTIF | LYD_OPT_RPC))) {
            /* validating parent of a nested notification/action, skip most checks */
            options |= LYD_OPT_TRUSTED;
        }
    }

    if (node->validity & LYD_VAL_MAND) {
        if (!(options & (LYD_OPT_TRUSTED | LYD_OPT_NOTIF_FILTER))) {
            /* check presence and correct order of all keys in case of list */
            if (schema->nodetype == LYS_LIST && !(options & (LYD_OPT_GET | LYD_OPT_GETCONFIG))) {
                if (lyv_keys(node)) {
                    return 1;
                }
            }

            if (schema->nodetype & (LYS_CONTAINER | LYS_LEAF | LYS_ANYDATA)) {
                /* check number of instances (similar to list uniqueness) for non-list nodes */

                /* find duplicity */
                start = lyd_first_sibling(node);
                for (diter = start; diter; diter = diter->next) {
                    if (diter->schema == schema && diter != node) {
                        parent = lys_parent(schema);
                        LOGVAL(ctx, LYE_TOOMANY, LY_VLOG_LYD, node, schema->name,
                               parent ? (parent->nodetype == LYS_EXT) ? ((struct lys_ext_instance *)parent)->arg_value : parent->name : "data tree");
                        return 1;
                    }
                }
            }

            if (options & LYD_OPT_OBSOLETE) {
                /* status - of the node's schema node itself and all its parents that
                * cannot have their own instance (like a choice statement) */
                siter = node->schema;
                do {
                    if (((siter->flags & LYS_STATUS_MASK) == LYS_STATUS_OBSLT) && (options & LYD_OPT_OBSOLETE)) {
                        LOGVAL(ctx, LYE_OBSDATA, LY_VLOG_LYD, node, schema->name);
                        return 1;
                    }
                    siter = lys_parent(siter);
                } while (siter && !(siter->nodetype & (LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_ANYDATA)));

                /* status of the identity value */
                if (schema->nodetype & (LYS_LEAF | LYS_LEAFLIST)) {
                    if (options & LYD_OPT_OBSOLETE) {
                        /* check that we are not instantiating obsolete type */
                        tpdf = ((struct lys_node_leaf *)node->schema)->type.der;
                        while (tpdf) {
                            if ((tpdf->flags & LYS_STATUS_MASK) == LYS_STATUS_OBSLT) {
                                LOGVAL(ctx, LYE_OBSTYPE, LY_VLOG_LYD, node, schema->name, tpdf->name);
                                return 1;
                            }
                            tpdf = tpdf->type.der;
                        }
                    }
                    if (((struct lyd_node_leaf_list *)node)->value_type == LY_TYPE_IDENT) {
                        ident = ((struct lyd_node_leaf_list *)node)->value.ident;
                        if (lyp_check_status(schema->flags, schema->module, schema->name,
                                        ident->flags, ident->module, ident->name, NULL)) {
                            LOGPATH(ctx, LY_VLOG_LYD, node);
                            return 1;
                        }
                    }
                }
            }
        }

        /* check validation function for extension */
        if (schema->flags & LYS_VALID_EXT) {
            // check extension in node
            if (lyv_extension(schema->ext, schema->ext_size, node)) {
                return EXIT_FAILURE;
            }

            if (schema->nodetype & (LYS_LEAF | LYS_LEAFLIST)) {
                type = &((struct lys_node_leaf *) schema)->type;
                leaf = (struct lyd_node_leaf_list *) node;
                if (lyv_type_extension(leaf, type, 1)) {
                    return EXIT_FAILURE;
                }
            }
        }

        /* remove the flag */
        node->validity &= ~LYD_VAL_MAND;
    }

    if (schema->nodetype & (LYS_LIST | LYS_CONTAINER | LYS_NOTIF | LYS_RPC | LYS_ACTION)) {
        siter = NULL;
        while ((siter = lys_getnext(siter, schema, NULL, 0))) {
            if (siter->nodetype & (LYS_LIST | LYS_LEAFLIST)) {
                LY_TREE_FOR(node->child, diter) {
                    if (diter->schema == siter && (diter->validity & LYD_VAL_DUP)) {
                        /* skip key uniqueness check in case of get/get-config data */
                        if (!(options & (LYD_OPT_TRUSTED | LYD_OPT_GET | LYD_OPT_GETCONFIG))) {
                            if (lyv_data_dup(diter, node->child)) {
                                return 1;
                            }
                        } else {
                            /* always remove the flag */
                            diter->validity &= ~LYD_VAL_DUP;
                        }
                        /* all schema instances checked, continue with another schema node */
                        break;
                    }
                }
            }
        }
    }

    if (node->validity & LYD_VAL_UNIQUE) {
        if (options & LYD_OPT_TRUSTED) {
            /* just remove flag */
            node->validity &= ~LYD_VAL_UNIQUE;
        } else {
            /* check the unique constraint at the end (once the parsing is done) */
            if (unres_data_add(unres, node, UNRES_UNIQ_LEAVES)) {
                return 1;
            }
        }
    }

    if (schema->nodetype & (LYS_LEAF | LYS_LEAFLIST)) {
        /* since feature can be enabled/disabled, do this check despite the validity flag,
         * - check if the type value (enum, bit, identity) is disabled via feature  */
        leaf = (struct lyd_node_leaf_list *)node;
        switch (leaf->value_type) {
        case LY_TYPE_BITS:
            id = "Bit";
            /* get the count of bits */
            type = find_orig_type(&((struct lys_node_leaf *)leaf->schema)->type, LY_TYPE_BITS);
            for (j = iff_size = 0; j < type->info.bits.count; j++) {
                if (!leaf->value.bit[j]) {
                    continue;
                }
                idname = leaf->value.bit[j]->name;
                iff_size = leaf->value.bit[j]->iffeature_size;
                iff = leaf->value.bit[j]->iffeature;
                break;
nextbit:
                iff_size = 0;
            }
            break;
        case LY_TYPE_ENUM:
            id = "Enum";
            idname = leaf->value_str;
            iff_size = leaf->value.enm->iffeature_size;
            iff = leaf->value.enm->iffeature;
            break;
        case LY_TYPE_IDENT:
            id = "Identity";
            idname = leaf->value_str;
            iff_size = leaf->value.ident->iffeature_size;
            iff = leaf->value.ident->iffeature;
            break;
        default:
            iff_size = 0;
            break;
        }

        if (iff_size) {
            for (i = 0; i < iff_size; i++) {
                if (!resolve_iffeature(&iff[i])) {
                    LOGVAL(ctx, LYE_INVAL, LY_VLOG_LYD, node, leaf->value_str, schema->name);
                    LOGVAL(ctx, LYE_SPEC, LY_VLOG_PREV, NULL, "%s \"%s\" is disabled by its if-feature condition.",
                           id, idname);
                    return 1;
                }
            }
            if (leaf->value_type == LY_TYPE_BITS) {
                goto nextbit;
            }
        }
    }

    /* check must conditions */
    if (!(options & (LYD_OPT_TRUSTED | LYD_OPT_NOTIF_FILTER | LYD_OPT_EDIT | LYD_OPT_GET | LYD_OPT_GETCONFIG))) {
        i = resolve_applies_must(node);
        if ((i & 0x1) && unres_data_add(unres, node, UNRES_MUST)) {
            return 1;
        }
        if ((i & 0x2) && unres_data_add(unres, node, UNRES_MUST_INOUT)) {
            return 1;
        }
    }

    return 0;
}